

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

lhpage * lhNewPage(lhash_kv_engine *pEngine,unqlite_page *pRaw,lhpage *pMaster)

{
  lhash_kv_engine *local_38;
  lhpage *pPage;
  lhpage *pMaster_local;
  unqlite_page *pRaw_local;
  lhash_kv_engine *pEngine_local;
  
  pEngine_local = (lhash_kv_engine *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x60);
  if (pEngine_local == (lhash_kv_engine *)0x0) {
    pEngine_local = (lhash_kv_engine *)0x0;
  }
  else {
    SyZero(pEngine_local,0x60);
    pEngine_local->pIo = (unqlite_kv_io *)pEngine;
    (pEngine_local->sAllocator).pMutexMethods = (SyMutexMethods *)pRaw;
    local_38 = pEngine_local;
    if (pMaster != (lhpage *)0x0) {
      local_38 = (lhash_kv_engine *)pMaster;
    }
    *(lhash_kv_engine **)&(pEngine_local->sAllocator).nMagic = local_38;
    if (*(lhash_kv_engine **)&(pEngine_local->sAllocator).nMagic != pEngine_local) {
      (pEngine_local->sAllocator).apPool[1] = (SyMemHeader *)pMaster->pSlave;
      pMaster->pSlave = (lhpage *)pEngine_local;
      pMaster->iSlave = pMaster->iSlave + 1;
    }
    pRaw->pUserData = pEngine_local;
  }
  return (lhpage *)pEngine_local;
}

Assistant:

static lhpage * lhNewPage(
	lhash_kv_engine *pEngine, /* KV store which own this instance */
	unqlite_page *pRaw,       /* Raw page contents */
	lhpage *pMaster           /* Master page in case we are dealing with a slave page */
	)
{
	lhpage *pPage;
	/* Allocate a new instance */
	pPage = (lhpage *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhpage));
	if( pPage == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pPage,sizeof(lhpage));
	/* Fill-in the structure */
	pPage->pHash = pEngine;
	pPage->pRaw = pRaw;
	pPage->pMaster = pMaster ? pMaster /* Slave page */ : pPage /* Master page */ ;
	if( pPage->pMaster != pPage ){
		/* Slave page, attach it to its master */
		pPage->pNextSlave = pMaster->pSlave;
		pMaster->pSlave = pPage;
		pMaster->iSlave++;
	}
	/* Save this instance for future fast lookup */
	pRaw->pUserData = pPage;
	/* All done */
	return pPage;
}